

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BoxCoordinatesMode::SerializeWithCachedSizes
          (BoxCoordinatesMode *this,CodedOutputStream *output)

{
  BoxCoordinatesMode_Coordinates BVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BoxCoordinatesMode *this_local;
  
  BVar1 = boxmode(this);
  if (BVar1 != BoxCoordinatesMode_Coordinates_CORNERS_HEIGHT_FIRST) {
    BVar1 = boxmode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,BVar1,output);
  }
  return;
}

Assistant:

void BoxCoordinatesMode::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BoxCoordinatesMode)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.BoxCoordinatesMode.Coordinates boxMode = 1;
  if (this->boxmode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->boxmode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BoxCoordinatesMode)
}